

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operand.h
# Opt level: O0

error inv<56>(context *ctx,token *token,opcode *op)

{
  token *in_RCX;
  opcode *op_local;
  token *token_local;
  context *ctx_local;
  
  assemble_flag(ctx,(opcode *)token,in_RCX,(char *)op,0x14984c);
  return (unique_ptr<char[],_std::default_delete<char[]>_>)
         (unique_ptr<char[],_std::default_delete<char[]>_>)ctx;
}

Assistant:

DEFINE_OPERAND(default_rz)
{
    op.add_bits(0xFFULL << address);
    return {};
}